

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

ostream * operator<<(ostream *out,
                    vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *v)

{
  pointer pcVar1;
  pointer pcVar2;
  ostream *poVar3;
  long lVar4;
  int i;
  ulong uVar5;
  
  std::operator<<(out,"[");
  lVar4 = 0;
  uVar5 = 0;
  while( true ) {
    pcVar1 = (v->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pcVar2 = (v->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (((long)pcVar2 - (long)pcVar1 >> 4) - 1U <= uVar5) break;
    poVar3 = std::operator<<(out,(complex *)(pcVar1->_M_value + lVar4));
    std::operator<<(poVar3,", ");
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x10;
  }
  poVar3 = std::operator<<(out,(complex *)(pcVar2 + -1));
  std::operator<<(poVar3,"]");
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const std::vector<T> &v)
{
    out << "[";
    for (auto i = 0; i < v.size() - 1; i++)
    {
        out << v[i] << ", ";
    }
    out << v.back() << "]";

    return out;
}